

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O1

void __thiscall
phosg::PrefixedLogger::PrefixedLogger(PrefixedLogger *this,string *prefix,LogLevel min_level)

{
  pointer pcVar1;
  
  (this->prefix)._M_dataplus._M_p = (pointer)&(this->prefix).field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + prefix->_M_string_length);
  this->min_level = min_level;
  return;
}

Assistant:

PrefixedLogger::PrefixedLogger(const string& prefix, LogLevel min_level)
    : prefix(prefix),
      min_level(min_level) {}